

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O1

int fy_atom_memcmp(fy_atom *atom,void *ptr,size_t len)

{
  byte *pbVar1;
  byte bVar2;
  fy_input *pfVar3;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  bool bVar10;
  fy_atom_iter iter;
  fy_atom_iter fStack_218;
  
  if ((atom == (fy_atom *)0x0 && ptr == (void *)0x0) && len == 0) {
    return 0;
  }
  if ((ptr != (void *)0x0 || len != 0) && atom == (fy_atom *)0x0) {
    return -1;
  }
  if ((ptr == (void *)0x0 || len == 0) && atom != (fy_atom *)0x0) {
    return 1;
  }
  if ((atom->field_0x35 & 4) == 0) {
    fy_atom_iter_start(atom,&fStack_218);
    uVar4 = fy_atom_iter_getc(&fStack_218);
    bVar10 = len != 0;
    uVar5 = 0xffffffff;
    if (bVar10 && -1 < (int)uVar4) {
      bVar2 = *ptr;
      uVar5 = (uint)bVar2;
      if (uVar4 == bVar2) {
        sVar8 = 1;
        uVar5 = (uint)bVar2;
        do {
          uVar4 = fy_atom_iter_getc(&fStack_218);
          bVar10 = len != sVar8;
          if (((int)uVar4 < 0) || (len == sVar8)) break;
          pbVar1 = (byte *)((long)ptr + sVar8);
          uVar5 = (uint)*pbVar1;
          sVar8 = sVar8 + 1;
        } while (uVar4 == *pbVar1);
      }
    }
    if (fStack_218.chunks != fStack_218.startup_chunks &&
        fStack_218.chunks != (fy_atom_iter_chunk *)0x0) {
      free(fStack_218.chunks);
    }
    if (!(bool)(uVar4 != 0xffffffff | bVar10)) {
      return 0;
    }
    return (uint)((int)uVar5 <= (int)uVar4) * 2 + -1;
  }
  if (atom == (fy_atom *)0x0) {
    uVar9 = 0;
    pvVar6 = (void *)0x0;
    goto LAB_00141289;
  }
  uVar9 = (atom->end_mark).input_pos - (atom->start_mark).input_pos;
  pfVar3 = atom->fyi;
  lVar7 = 0x48;
  switch((pfVar3->cfg).type) {
  case fyit_file:
    pvVar6 = (pfVar3->field_11).file.addr;
    if (pvVar6 == (void *)0x0) goto switchD_00141260_caseD_1;
    break;
  case fyit_memory:
  case fyit_alloc:
    lVar7 = 0x28;
  case fyit_stream:
switchD_00141260_caseD_1:
    pvVar6 = *(void **)((long)&(pfVar3->node).next + lVar7);
    break;
  default:
    pvVar6 = (void *)0x0;
  }
  if (pvVar6 == (void *)0x0) {
    __assert_fail("ptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.h"
                  ,0x9a,"const void *fy_input_start(const struct fy_input *)");
  }
  pvVar6 = (void *)((long)pvVar6 + (atom->start_mark).input_pos);
LAB_00141289:
  sVar8 = len;
  if (uVar9 < len) {
    sVar8 = uVar9;
  }
  uVar5 = memcmp(pvVar6,ptr,sVar8);
  if ((uVar5 == 0) && (uVar5 = -(uint)(uVar9 < len) | 1, uVar9 == len)) {
    uVar5 = 0;
  }
  return uVar5;
}

Assistant:

int fy_atom_memcmp(struct fy_atom *atom, const void *ptr, size_t len) {
    const char *dstr, *str;
    size_t dlen, tlen;
    struct fy_atom_iter iter;
    int c, ct, ret;

    /* empty? just fine */
    if (!atom && !ptr && !len)
        return 0;

    /* empty atom but not ptr */
    if (!atom && (ptr || len))
        return -1;

    /* non empty atom and empty ptr */
    if (atom && (!ptr || !len))
        return 1;

    /* direct output, nice */
    if (atom->direct_output) {
        dlen = fy_atom_size(atom);
        dstr = fy_atom_data(atom);
        tlen = dlen > len ? len : dlen;
        ret = memcmp(dstr, ptr, tlen);
        if (ret)
            return ret;

        return dlen == len ? 0 : len > dlen ? -1 : 1;
    }

    str = ptr;
    ct = -1;
    fy_atom_iter_start(atom, &iter);
    while ((c = fy_atom_iter_getc(&iter)) >= 0 && len) {
        ct = *str & 0xff;
        if (ct != c)
            break;
        str++;
        len--;
    }
    fy_atom_iter_finish(&iter);

    /* out of data on both */
    if (c == -1 && !len)
        return 0;

    return ct > c ? -1 : 1;
}